

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

char * cimg_library::cimg::medcon_path(char *user_path,bool reinit_path)

{
  FILE *__stream;
  byte in_SIL;
  char *in_RDI;
  FILE *file;
  bool path_found;
  
  if ((in_SIL & 1) != 0) {
    if (medcon_path::st_path != (char *)0x0) {
      operator_delete__(medcon_path::st_path);
    }
    medcon_path::st_path = (char *)0x0;
  }
  if (in_RDI == (char *)0x0) {
    if (medcon_path::st_path == (char *)0x0) {
      medcon_path::st_path = (char *)operator_new__(0x400);
      memset(medcon_path::st_path,0,0x400);
      strcpy(medcon_path::st_path,"./medcon");
      __stream = ::fopen(medcon_path::st_path,"r");
      if (__stream == (FILE *)0x0) {
        strcpy(medcon_path::st_path,"medcon");
      }
      else {
        fclose(__stream);
      }
      winformat_string(medcon_path::st_path);
    }
  }
  else {
    if (medcon_path::st_path == (char *)0x0) {
      medcon_path::st_path = (char *)operator_new__(0x400);
    }
    memset(medcon_path::st_path,0,0x400);
    strncpy(medcon_path::st_path,in_RDI,0x3ff);
  }
  return medcon_path::st_path;
}

Assistant:

inline const char* medcon_path(const char *const user_path=0, const bool reinit_path=false) {
      static char *st_path = 0;
      if (reinit_path) { delete[] st_path; st_path = 0; }
      if (user_path) {
        if (!st_path) st_path = new char[1024];
        std::memset(st_path,0,1024);
        std::strncpy(st_path,user_path,1023);
      } else if (!st_path) {
        st_path = new char[1024];
        std::memset(st_path,0,1024);
        bool path_found = false;
        std::FILE *file = 0;
#if cimg_OS==2
        const char *const pf_path = programfiles_path();
        if (!path_found) {
          std::strcpy(st_path,".\\medcon.exe");
          if ((file=std::fopen(st_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) {
          cimg_snprintf(st_path,sizeof(st_path),"%s\\XMedCon\\bin\\medcon.bat",pf_path);
          if ((file=std::fopen(st_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) {
          cimg_snprintf(st_path,sizeof(st_path),"%s\\XMedCon\\bin\\medcon.exe",pf_path);
          if ((file=std::fopen(st_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) std::strcpy(st_path,"medcon.exe");
#else
        if (!path_found) {
          std::strcpy(st_path,"./medcon");
          if ((file=std::fopen(st_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) std::strcpy(st_path,"medcon");
#endif
        winformat_string(st_path);
      }
      return st_path;
    }